

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O0

size_t __thiscall tsbp::LeftmostActiveOnly::FindMaximumItemDx(LeftmostActiveOnly *this)

{
  reference pvVar1;
  Rectangle *pRVar2;
  Rectangle *item;
  size_t i;
  size_t domainReducedItemIndex;
  int maxDx;
  LeftmostActiveOnly *this_local;
  
  pvVar1 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                     ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&this->items,0);
  domainReducedItemIndex._4_4_ = pvVar1->Dx;
  i = 0;
  item = (Rectangle *)&DAT_00000001;
  while( true ) {
    pRVar2 = (Rectangle *)
             CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items)
    ;
    if (pRVar2 <= item) break;
    pvVar1 = std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator[]
                       ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&this->items,
                        (size_type)item);
    if (domainReducedItemIndex._4_4_ < pvVar1->Dx) {
      domainReducedItemIndex._4_4_ = pvVar1->Dx;
      i = (size_t)item;
    }
    item = (Rectangle *)((long)&item->X + 1);
  }
  return i;
}

Assistant:

size_t LeftmostActiveOnly::FindMaximumItemDx()
{
    int maxDx = this->items[0].Dx;

    size_t domainReducedItemIndex = 0;
    for (size_t i = 1; i < this->items.size(); i++)
    {
        const Rectangle& item = this->items[i];

        if (item.Dx > maxDx)
        {
            maxDx = item.Dx;
            domainReducedItemIndex = i;
        }
    }

    return domainReducedItemIndex;
}